

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O1

Linear<std::__cxx11::basic_string<char>,_double> * __thiscall
cimod::
BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
::get_linear(Linear<std::__cxx11::basic_string<char>,_double> *__return_storage_ptr__,
            BinaryQuadraticModel<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_cimod::Dense>
            *this)

{
  double dVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  pointer pbVar6;
  ulong uVar7;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  pbVar6 = (this->_idx_to_label).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->_idx_to_label).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6;
  if (lVar3 != 0) {
    uVar4 = lVar3 >> 5;
    lVar3 = 0;
    uVar7 = 0;
    do {
      if ((((long)uVar4 < 0) ||
          ((this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows <= (long)uVar7)) ||
         (lVar2 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar2 <= (long)uVar4)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 0]"
                     );
      }
      dVar1 = (this->_quadmat).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data[lVar2 * uVar7 + uVar4];
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)__return_storage_ptr__,
                              (key_type *)((long)&(pbVar6->_M_dataplus)._M_p + lVar3));
        *pmVar5 = dVar1;
      }
      uVar7 = uVar7 + 1;
      pbVar6 = (this->_idx_to_label).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)(this->_idx_to_label).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5;
      lVar3 = lVar3 + 0x20;
    } while (uVar7 < uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Linear<IndexType, FloatType> get_linear() const {
      return _generate_linear();
    }